

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

char * tcg_find_helper(TCGContext_conflict9 *s,uintptr_t val)

{
  gpointer pvVar1;
  TCGHelperInfo *info;
  char *ret;
  uintptr_t val_local;
  TCGContext_conflict9 *s_local;
  
  info = (TCGHelperInfo *)0x0;
  if ((s->helper_table != (GHashTable *)0x0) &&
     (pvVar1 = g_hash_table_lookup(s->helper_table,(gconstpointer)val), pvVar1 != (gpointer)0x0)) {
    info = *(TCGHelperInfo **)((long)pvVar1 + 8);
  }
  return (char *)info;
}

Assistant:

static inline const char *tcg_find_helper(TCGContext *s, uintptr_t val)
{
    const char *ret = NULL;
    if (s->helper_table) {
        TCGHelperInfo *info = g_hash_table_lookup(s->helper_table, (gpointer)val);
        if (info) {
            ret = info->name;
        }
    }
    return ret;
}